

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Abc_NtkDfsOne_rec(Abc_Obj_t *pObj,Vec_Int_t *vTfi,int nLevelMin,int CiLabel)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  int *piVar6;
  void **ppvVar7;
  void *pvVar8;
  void *pvVar9;
  long *plVar10;
  uint uVar11;
  int iVar12;
  Vec_Int_t *pVVar13;
  word wVar14;
  int Fill;
  long lVar15;
  word uFanins [6];
  word local_68 [7];
  
  pAVar3 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,nLevelMin);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar12 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar12) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar12;
    uVar11 = *(uint *)&pObj->field_0x14 & 0xf;
    if (((uVar11 == 2) || (uVar11 == 5)) ||
       (((int)(*(uint *)&pObj->field_0x14 >> 0xc) < nLevelMin && (0 < (pObj->vFanins).nSize)))) {
      Vec_IntPush(vTfi,pObj->Id);
      (pObj->field_6).iTemp = CiLabel;
      return CiLabel;
    }
    if (uVar11 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmDec.c"
                    ,0x593,"int Abc_NtkDfsOne_rec(Abc_Obj_t *, Vec_Int_t *, int, int)");
    }
    iVar1 = (pObj->vFanins).nSize;
    iVar12 = 0;
    if (iVar1 == 0) {
      iVar12 = CiLabel;
    }
    (pObj->field_6).iTemp = iVar12;
    if (0 < iVar1) {
      lVar15 = 0;
      do {
        uVar11 = Abc_NtkDfsOne_rec((Abc_Obj_t *)
                                   pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar15]],vTfi,
                                   nLevelMin,CiLabel);
        (pObj->field_6).iTemp = (pObj->field_6).iTemp | uVar11;
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pObj->vFanins).nSize);
    }
    Vec_IntPush(vTfi,pObj->Id);
    plVar5 = (long *)pObj->pNtk->pData;
    if (*(int *)(*plVar5 + 0x5c) != 0) {
      uVar11 = pObj->Id;
      pVVar13 = Mio_GateReadExpr((Mio_Gate_t *)(pObj->field_5).pData);
      iVar1 = (pObj->vFanins).nSize;
      if (6 < (long)iVar1) {
        __assert_fail("Abc_ObjFaninNum(pObj) <= 6",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmDec.c"
                      ,0x13a,"word Sfm_ObjSimulate(Abc_Obj_t *)");
      }
      if (0 < iVar1) {
        piVar6 = (pObj->vFanins).pArray;
        ppvVar7 = pObj->pNtk->vObjs->pArray;
        lVar15 = 0;
        do {
          iVar12 = *(int *)((long)ppvVar7[piVar6[lVar15]] + 0x10);
          if (((long)iVar12 < 0) || (*(int *)((long)plVar5 + 0x144) <= iVar12)) goto LAB_004d91c5;
          local_68[lVar15] = *(word *)(plVar5[0x29] + (long)iVar12 * 8);
          lVar15 = lVar15 + 1;
        } while (iVar1 != lVar15);
      }
      wVar14 = Exp_Truth6(iVar1,pVVar13,local_68);
      if (((int)uVar11 < 0) || (*(int *)((long)plVar5 + 0x144) <= (int)uVar11)) {
LAB_004d9222:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      *(word *)(plVar5[0x29] + (ulong)uVar11 * 8) = wVar14;
      if (((ulong)pObj->field_6 & 0x10) != 0) {
        uVar11 = pObj->Id;
        pvVar8 = pObj->pNtk->pData;
        pVVar13 = Mio_GateReadExpr((Mio_Gate_t *)(pObj->field_5).pData);
        iVar1 = (pObj->vFanins).nSize;
        if (0 < (long)iVar1) {
          piVar6 = (pObj->vFanins).pArray;
          ppvVar7 = pObj->pNtk->vObjs->pArray;
          lVar15 = 0;
          do {
            pvVar9 = ppvVar7[piVar6[lVar15]];
            uVar2 = *(uint *)((long)pvVar9 + 0x10);
            if ((*(byte *)((long)pvVar9 + 0x40) & 0x10) == 0) {
              if ((int)uVar2 < 0) {
LAB_004d91c5:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                              ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
              }
              iVar12 = *(int *)((long)pvVar8 + 0x144);
              plVar10 = (long *)((long)pvVar8 + 0x148);
            }
            else {
              if ((int)uVar2 < 0) goto LAB_004d91c5;
              iVar12 = *(int *)((long)pvVar8 + 0x154);
              plVar10 = (long *)((long)pvVar8 + 0x158);
            }
            if (iVar12 <= (int)uVar2) goto LAB_004d91c5;
            local_68[lVar15] = *(word *)(*plVar10 + (ulong)uVar2 * 8);
            lVar15 = lVar15 + 1;
          } while (iVar1 != lVar15);
        }
        wVar14 = Exp_Truth6(iVar1,pVVar13,local_68);
        if (((int)uVar11 < 0) || (*(int *)((long)plVar5 + 0x154) <= (int)uVar11)) goto LAB_004d9222;
        *(word *)(plVar5[0x2b] + (ulong)uVar11 * 8) = wVar14;
      }
    }
  }
  return (pObj->field_6).iTemp;
}

Assistant:

int Abc_NtkDfsOne_rec( Abc_Obj_t * pObj, Vec_Int_t * vTfi, int nLevelMin, int CiLabel )
{
    Abc_Obj_t * pFanin; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return pObj->iTemp;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) )
    {
        Vec_IntPush( vTfi, Abc_ObjId(pObj) );
        return (pObj->iTemp = CiLabel);
    }
    assert( Abc_ObjIsNode(pObj) );
    pObj->iTemp = Abc_ObjFaninNum(pObj) ? 0 : CiLabel;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        pObj->iTemp |= Abc_NtkDfsOne_rec( pFanin, vTfi, nLevelMin, CiLabel );
    Vec_IntPush( vTfi, Abc_ObjId(pObj) );
    Sfm_ObjSimulateNode( pObj );
    return pObj->iTemp;
}